

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

nng_err nni_http_handler_init(nni_http_handler **hp,char *uri,nng_http_handler_func cb)

{
  int iVar1;
  nni_http_handler *pnVar2;
  size_t sVar3;
  nni_http_handler *h;
  nng_http_handler_func cb_local;
  char *uri_local;
  nni_http_handler **hp_local;
  
  pnVar2 = (nni_http_handler *)nni_zalloc(0x5f8);
  if (pnVar2 != (nni_http_handler *)0x0) {
    nni_atomic_init(&pnVar2->ref);
    nni_atomic_inc(&pnVar2->ref);
    if (((uri == (char *)0x0) || (sVar3 = strlen(uri), sVar3 == 0)) ||
       (iVar1 = strcmp(uri,"/"), cb_local = (nng_http_handler_func)uri, iVar1 == 0)) {
      cb_local = (nng_http_handler_func)0x1632a4;
    }
    snprintf(pnVar2->uri,0x400,"%s",cb_local);
    (pnVar2->node).ln_next = (nni_list_node *)0x0;
    (pnVar2->node).ln_prev = (nni_list_node *)0x0;
    pnVar2->cb = cb;
    pnVar2->data = (void *)0x0;
    pnVar2->dtor = (nni_cb)0x0;
    pnVar2->tree = false;
    pnVar2->maxbody = 0x100000;
    pnVar2->getbody = true;
    strcpy(pnVar2->method,"GET");
    strcpy(pnVar2->host,"");
    *hp = pnVar2;
    return NNG_OK;
  }
  return NNG_ENOMEM;
}

Assistant:

nng_err
nni_http_handler_init(
    nni_http_handler **hp, const char *uri, nng_http_handler_func cb)
{
	nni_http_handler *h;

	if ((h = NNI_ALLOC_STRUCT(h)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_atomic_init(&h->ref);
	nni_atomic_inc(&h->ref);

	// Default for HTTP is /.  But remap it to "" for ease of matching.
	if ((uri == NULL) || (strlen(uri) == 0) || (strcmp(uri, "/") == 0)) {
		uri = "";
	}
	(void) snprintf(h->uri, sizeof(h->uri), "%s", uri);
	NNI_LIST_NODE_INIT(&h->node);
	h->cb      = cb;
	h->data    = NULL;
	h->dtor    = NULL;
	h->tree    = false;
	h->maxbody = 1024 * 1024; // Up to 1MB of body
	h->getbody = true;
	(void) strcpy(h->method, "GET");
	(void) strcpy(h->host, "");
	*hp = h;
	return (NNG_OK);
}